

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O3

void SoftForkDescPushBack
               (CBlockIndex *blockindex,UniValue *softforks,ChainstateManager *chainman,
               DeploymentPos id)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  CChainParams *params;
  string key;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  string key_04;
  string key_05;
  string key_06;
  string key_07;
  string key_08;
  string key_09;
  string key_10;
  string key_11;
  string key_12;
  string key_13;
  string key_14;
  string key_15;
  string key_16;
  string key_17;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  UniValue val_05;
  UniValue val_06;
  UniValue val_07;
  UniValue val_08;
  UniValue val_09;
  UniValue val_10;
  UniValue val_11;
  UniValue val_12;
  UniValue val_13;
  UniValue val_14;
  UniValue val_15;
  UniValue val_16;
  UniValue val_17;
  void *pvVar3;
  undefined2 uVar4;
  ThresholdState TVar5;
  ThresholdState TVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  char *pcVar9;
  ulong uVar10;
  pointer pUVar11;
  char *pcVar12;
  char __c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  DeploymentPos pos;
  ulong uVar14;
  long in_FS_OFFSET;
  BIP9Stats statsStruct;
  string sig;
  UniValue rv;
  UniValue bip9;
  undefined1 in_stack_fffffffffffff528 [12];
  ChainstateManager *pCVar15;
  ChainstateManager *pCVar16;
  undefined8 in_stack_fffffffffffff540;
  undefined8 in_stack_fffffffffffff548;
  CBlockIndex *pCVar17;
  undefined4 in_stack_fffffffffffff550;
  undefined4 uVar18;
  VersionBitsCache *this;
  VersionBitsCache *pVVar19;
  undefined8 in_stack_fffffffffffff568;
  undefined1 in_stack_fffffffffffff570 [24];
  int in_stack_fffffffffffff588;
  undefined4 in_stack_fffffffffffff58c;
  uint in_stack_fffffffffffff590;
  undefined4 in_stack_fffffffffffff594;
  pointer in_stack_fffffffffffff598;
  pointer pUVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a28;
  vector<UniValue,_std::allocator<UniValue>_> local_a10;
  long *local_9f8 [2];
  long local_9e8 [2];
  VType local_9d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_9d0;
  size_type local_9c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9b0;
  vector<UniValue,_std::allocator<UniValue>_> local_998;
  long *local_980 [2];
  long local_970 [2];
  UniValue local_960;
  long *local_908 [2];
  long local_8f8 [2];
  UniValue local_8e8;
  long *local_890 [2];
  long local_880 [2];
  UniValue local_870;
  long *local_818 [2];
  long local_808 [2];
  undefined1 *local_7f8;
  undefined8 local_7f0;
  undefined1 local_7e8 [9];
  undefined4 local_7df;
  undefined2 local_7db;
  char local_7d9;
  UniValue local_7d8;
  long *local_780 [2];
  long local_770 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  VType local_740;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_738;
  size_type local_730;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_728;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_718;
  vector<UniValue,_std::allocator<UniValue>_> local_700;
  long *local_6e8 [2];
  long local_6d8 [2];
  UniValue local_6c8;
  long *local_670 [2];
  long local_660 [2];
  UniValue local_650;
  long *local_5f8 [2];
  long local_5e8 [2];
  UniValue local_5d8;
  long *local_580 [2];
  long local_570 [2];
  UniValue local_560;
  long *local_508 [2];
  long local_4f8 [2];
  UniValue local_4e8;
  long *local_490 [2];
  long local_480 [2];
  undefined1 *local_470;
  undefined8 local_468;
  undefined1 local_460 [9];
  undefined4 local_457;
  undefined2 local_453;
  char local_451;
  undefined1 local_450 [22];
  char acStack_43a [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_428;
  vector<UniValue,_std::allocator<UniValue>_> vStack_410;
  UniValue local_3f8;
  long *local_3a0 [2];
  long local_390 [2];
  UniValue local_380;
  long *local_328 [2];
  long local_318 [2];
  UniValue local_308;
  long *local_2b0 [2];
  long local_2a0 [2];
  UniValue local_290;
  long *local_238 [2];
  long local_228 [2];
  UniValue local_218;
  long *local_1c0 [2];
  long local_1b0 [2];
  UniValue local_1a0;
  long *local_148 [2];
  long local_138 [2];
  UniValue local_128;
  long *local_d0 [2];
  long local_c0 [2];
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [9];
  undefined4 local_97;
  undefined2 local_93;
  char local_91;
  UniValue local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (DEPLOYMENT_TAPROOT < id) {
    __assert_fail("Consensus::ValidDeployment(dep)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/deploymentstatus.h"
                  ,0x30,
                  "bool DeploymentEnabled(const Consensus::Params &, Consensus::DeploymentPos)");
  }
  if (blockindex == (CBlockIndex *)0x0) goto LAB_009d8a50;
  params = (chainman->m_options).chainparams;
  uVar14 = (ulong)id;
  if ((params->consensus).vDeployments[id].nStartTime == -2) goto LAB_009d8a50;
  local_b0 = local_a0;
  local_90.val._M_dataplus._M_p = (pointer)&local_90.val.field_2;
  local_90.typ = VOBJ;
  local_90.val.field_2._M_local_buf[0] = '\0';
  local_90.val.field_2._M_allocated_capacity._1_7_ = (undefined7)local_a0._1_8_;
  local_90.val.field_2._M_local_buf[8] = SUB81(local_a0._1_8_,7);
  local_90.val.field_2._9_4_ = local_97;
  local_90.val.field_2._13_2_ = local_93;
  local_90.val.field_2._M_local_buf[0xf] = local_91;
  local_90.val._M_string_length = 0;
  local_a8 = 0;
  local_a0[0] = 0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = &chainman->m_versionbitscache;
  TVar5 = VersionBitsCache::State(this,blockindex,&params->consensus,id);
  uVar4 = (short)((ulong)stack0xfffffffffffffbc0 >> 0x38);
  TVar6 = VersionBitsCache::State
                    (this,blockindex->pprev,&((chainman->m_options).chainparams)->consensus,id);
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  uVar7 = TVar6 - STARTED;
  pCVar15 = chainman;
  uVar18 = extraout_var;
  if (uVar7 < 2) {
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"bit","");
    stack0xfffffffffffffbc7 = uVar4;
    uVar4 = stack0xfffffffffffffbc7;
    UniValue::UniValue<const_int_&,_int,_true>
              (&local_128,&(((chainman->m_options).chainparams)->consensus).vDeployments[id].bit);
    stack0xfffffffffffffbc7 = uVar4;
    uVar4 = stack0xfffffffffffffbc7;
    key._M_string_length._4_4_ = TVar5;
    key._0_12_ = in_stack_fffffffffffff528;
    key.field_2._M_allocated_capacity = (size_type)pCVar15;
    key.field_2._8_8_ = in_stack_fffffffffffff540;
    val.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff550;
    val._0_8_ = in_stack_fffffffffffff548;
    val.val._M_dataplus._M_p._4_4_ = uVar7;
    val.val._M_string_length._0_4_ = TVar6;
    val.val._M_string_length._4_4_ = uVar18;
    val.val.field_2._M_allocated_capacity = (size_type)this;
    val.val.field_2._8_8_ = in_stack_fffffffffffff568;
    val.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffff570;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff588;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff58c;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff590;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff594;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff598;
    UniValue::pushKV(&local_90,key,val);
    stack0xfffffffffffffbc7 = uVar4;
    uVar4 = stack0xfffffffffffffbc7;
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_128.values);
    stack0xfffffffffffffbc7 = uVar4;
    uVar4 = stack0xfffffffffffffbc7;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_128.keys);
    stack0xfffffffffffffbc7 = uVar4;
    uVar4 = stack0xfffffffffffffbc7;
    chainman = pCVar15;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.val._M_dataplus._M_p != &local_128.val.field_2) {
      operator_delete(local_128.val._M_dataplus._M_p,local_128.val.field_2._M_allocated_capacity + 1
                     );
      stack0xfffffffffffffbc7 = uVar4;
      uVar4 = stack0xfffffffffffffbc7;
      chainman = pCVar15;
    }
    stack0xfffffffffffffbc7 = uVar4;
    uVar4 = stack0xfffffffffffffbc7;
    pCVar15 = chainman;
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
      stack0xfffffffffffffbc7 = uVar4;
      uVar4 = stack0xfffffffffffffbc7;
    }
  }
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"start_time","");
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  UniValue::UniValue<const_long_&,_long,_true>
            (&local_1a0,
             &(((chainman->m_options).chainparams)->consensus).vDeployments[id].nStartTime);
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  key_00._M_string_length._4_4_ = TVar5;
  key_00._0_12_ = in_stack_fffffffffffff528;
  key_00.field_2._M_allocated_capacity = (size_type)pCVar15;
  key_00.field_2._8_8_ = in_stack_fffffffffffff540;
  val_00.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff550;
  val_00._0_8_ = in_stack_fffffffffffff548;
  val_00.val._M_dataplus._M_p._4_4_ = uVar7;
  val_00.val._M_string_length._0_4_ = TVar6;
  val_00.val._M_string_length._4_4_ = uVar18;
  val_00.val.field_2._M_allocated_capacity = (size_type)this;
  val_00.val.field_2._8_8_ = in_stack_fffffffffffff568;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff570;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff588;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff58c;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff590;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff594;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff598;
  UniValue::pushKV(&local_90,key_00,val_00);
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1a0.values);
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a0.keys);
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.val._M_dataplus._M_p != &local_1a0.val.field_2) {
    operator_delete(local_1a0.val._M_dataplus._M_p,local_1a0.val.field_2._M_allocated_capacity + 1);
    stack0xfffffffffffffbc7 = uVar4;
    uVar4 = stack0xfffffffffffffbc7;
  }
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  pCVar16 = pCVar15;
  if (local_148[0] != local_138) {
    operator_delete(local_148[0],local_138[0] + 1);
    stack0xfffffffffffffbc7 = uVar4;
    uVar4 = stack0xfffffffffffffbc7;
  }
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"timeout","");
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  UniValue::UniValue<const_long_&,_long,_true>
            (&local_218,&(((pCVar15->m_options).chainparams)->consensus).vDeployments[id].nTimeout);
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  key_01._M_string_length._4_4_ = TVar5;
  key_01._0_12_ = in_stack_fffffffffffff528;
  key_01.field_2._M_allocated_capacity = (size_type)pCVar16;
  key_01.field_2._8_8_ = in_stack_fffffffffffff540;
  val_01.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff550;
  val_01._0_8_ = in_stack_fffffffffffff548;
  val_01.val._M_dataplus._M_p._4_4_ = uVar7;
  val_01.val._M_string_length._0_4_ = TVar6;
  val_01.val._M_string_length._4_4_ = uVar18;
  val_01.val.field_2._M_allocated_capacity = (size_type)this;
  val_01.val.field_2._8_8_ = in_stack_fffffffffffff568;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff570;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff588;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff58c;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff590;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff594;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff598;
  UniValue::pushKV(&local_90,key_01,val_01);
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_218.values);
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_218.keys);
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.val._M_dataplus._M_p != &local_218.val.field_2) {
    operator_delete(local_218.val._M_dataplus._M_p,local_218.val.field_2._M_allocated_capacity + 1);
    stack0xfffffffffffffbc7 = uVar4;
    uVar4 = stack0xfffffffffffffbc7;
  }
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  pCVar15 = pCVar16;
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
    stack0xfffffffffffffbc7 = uVar4;
    uVar4 = stack0xfffffffffffffbc7;
  }
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"min_activation_height","");
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  UniValue::UniValue<const_int_&,_int,_true>
            (&local_290,
             &(((pCVar16->m_options).chainparams)->consensus).vDeployments[id].min_activation_height
            );
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  key_02._M_string_length._4_4_ = TVar5;
  key_02._0_12_ = in_stack_fffffffffffff528;
  key_02.field_2._M_allocated_capacity = (size_type)pCVar15;
  key_02.field_2._8_8_ = in_stack_fffffffffffff540;
  val_02.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff550;
  val_02._0_8_ = in_stack_fffffffffffff548;
  val_02.val._M_dataplus._M_p._4_4_ = uVar7;
  val_02.val._M_string_length._0_4_ = TVar6;
  val_02.val._M_string_length._4_4_ = uVar18;
  val_02.val.field_2._M_allocated_capacity = (size_type)this;
  val_02.val.field_2._8_8_ = in_stack_fffffffffffff568;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff570;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff588;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff58c;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff590;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff594;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff598;
  UniValue::pushKV(&local_90,key_02,val_02);
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_290.values);
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_290.keys);
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.val._M_dataplus._M_p != &local_290.val.field_2) {
    operator_delete(local_290.val._M_dataplus._M_p,local_290.val.field_2._M_allocated_capacity + 1);
    stack0xfffffffffffffbc7 = uVar4;
    uVar4 = stack0xfffffffffffffbc7;
  }
  stack0xfffffffffffffbc7 = uVar4;
  uVar4 = stack0xfffffffffffffbc7;
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] + 1);
    stack0xfffffffffffffbc7 = uVar4;
    uVar4 = stack0xfffffffffffffbc7;
  }
  stack0xfffffffffffffbc7 = uVar4;
  acStack_43a = (char  [2])stack0xfffffffffffffbc7;
  local_2b0[0] = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"status","");
  pcVar12 = acStack_43a + 1;
  pcVar1 = local_450 + 0x10;
  switch(TVar6) {
  case DEFINED:
    unique0x10004ea3 = CONCAT44((int)(CONCAT17(acStack_43a[1],0x64656e69000000) >> 0x20),0x69666564)
    ;
    break;
  case STARTED:
    unique0x10004edb = CONCAT44((int)(CONCAT17(acStack_43a[1],0x64657472000000) >> 0x20),0x72617473)
    ;
    break;
  case LOCKED_IN:
    pcVar9 = local_438._M_local_buf + 1;
    unique0x10004ebb = 0x695f64656b636f6c;
    local_438._M_local_buf[0] = 'n';
    local_450._8_8_ = (pointer)0x9;
    goto LAB_009d7a14;
  case ACTIVE:
    unique0x10004ecb = CONCAT44((int)(CONCAT26(acStack_43a,0x657600000000) >> 0x20),0x69746361);
    goto LAB_009d79dd;
  case FAILED:
    unique0x10004eb3 = CONCAT44((int)(CONCAT26(acStack_43a,0x646500000000) >> 0x20),0x6c696166);
LAB_009d79dd:
    local_450._8_8_ = (pointer)0x6;
    pcVar9 = acStack_43a;
    goto LAB_009d7a14;
  default:
    unique0x10004eeb = CONCAT44((int)(CONCAT17(acStack_43a[1],0x64696c61000000) >> 0x20),0x61766e69)
    ;
  }
  local_450._8_8_ = (pointer)0x7;
  pcVar9 = pcVar12;
LAB_009d7a14:
  *pcVar9 = '\0';
  local_450._0_8_ = pcVar1;
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_308,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_450);
  key_03._M_string_length._4_4_ = TVar5;
  key_03._0_12_ = in_stack_fffffffffffff528;
  key_03.field_2._M_allocated_capacity = (size_type)pCVar15;
  key_03.field_2._8_8_ = uVar14;
  val_03.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff550;
  val_03._0_8_ = blockindex;
  val_03.val._M_dataplus._M_p._4_4_ = uVar7;
  val_03.val._M_string_length._0_4_ = TVar6;
  val_03.val._M_string_length._4_4_ = uVar18;
  val_03.val.field_2._M_allocated_capacity = (size_type)this;
  val_03.val.field_2._8_8_ = softforks;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff570;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff588;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff58c;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff590;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff594;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff598;
  UniValue::pushKV(&local_90,key_03,val_03);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_308.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_308.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308.val._M_dataplus._M_p != &local_308.val.field_2) {
    operator_delete(local_308.val._M_dataplus._M_p,local_308.val.field_2._M_allocated_capacity + 1);
  }
  pCVar16 = pCVar15;
  if ((pointer)local_450._0_8_ != pcVar1) {
    operator_delete((void *)local_450._0_8_,stack0xfffffffffffffbc0 + 1);
  }
  if (local_2b0[0] != local_2a0) {
    operator_delete(local_2b0[0],local_2a0[0] + 1);
  }
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"since","");
  iVar8 = VersionBitsCache::StateSinceHeight
                    (this,blockindex->pprev,&((pCVar15->m_options).chainparams)->consensus,
                     (DeploymentPos)uVar14);
  local_450._0_4_ = iVar8;
  UniValue::UniValue<int,_int,_true>(&local_380,(int *)local_450);
  key_04._M_string_length._4_4_ = TVar5;
  key_04._0_12_ = in_stack_fffffffffffff528;
  key_04.field_2._M_allocated_capacity = (size_type)pCVar16;
  key_04.field_2._8_8_ = uVar14;
  val_04.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff550;
  val_04._0_8_ = blockindex;
  val_04.val._M_dataplus._M_p._4_4_ = uVar7;
  val_04.val._M_string_length._0_4_ = TVar6;
  val_04.val._M_string_length._4_4_ = uVar18;
  val_04.val.field_2._M_allocated_capacity = (size_type)this;
  val_04.val.field_2._8_8_ = softforks;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff570;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff588;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff58c;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff590;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff594;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff598;
  UniValue::pushKV(&local_90,key_04,val_04);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_380.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_380.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380.val._M_dataplus._M_p != &local_380.val.field_2) {
    operator_delete(local_380.val._M_dataplus._M_p,local_380.val.field_2._M_allocated_capacity + 1);
  }
  if (local_328[0] != local_318) {
    operator_delete(local_328[0],local_318[0] + 1);
  }
  local_3a0[0] = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"status_next","");
  uVar4 = (undefined2)((ulong)stack0xfffffffffffffbc0 >> 0x30);
  switch(TVar5) {
  case DEFINED:
    unique0x10004efb = CONCAT44((int)(CONCAT17(acStack_43a[1],0x64656e69000000) >> 0x20),0x69666564)
    ;
    break;
  case STARTED:
    unique0x10004f33 = CONCAT44((int)(CONCAT17(acStack_43a[1],0x64657472000000) >> 0x20),0x72617473)
    ;
    break;
  case LOCKED_IN:
    pcVar12 = local_438._M_local_buf + 1;
    unique0x10004f13 = 0x695f64656b636f6c;
    local_438._M_local_buf[0] = 'n';
    local_450._8_8_ = (pointer)0x9;
    goto LAB_009d7c72;
  case ACTIVE:
    unique0x10004f23 = CONCAT44((int)(CONCAT26(uVar4,0x657600000000) >> 0x20),0x69746361);
    goto LAB_009d7c3e;
  case FAILED:
    unique0x10004f0b = CONCAT44((int)(CONCAT26(uVar4,0x646500000000) >> 0x20),0x6c696166);
LAB_009d7c3e:
    local_450._8_8_ = (pointer)0x6;
    pcVar12 = acStack_43a;
    goto LAB_009d7c72;
  default:
    unique0x10004f43 = CONCAT44((int)(CONCAT17(acStack_43a[1],0x64696c61000000) >> 0x20),0x61766e69)
    ;
  }
  local_450._8_8_ = (pointer)0x7;
LAB_009d7c72:
  *pcVar12 = '\0';
  local_450._0_8_ = pcVar1;
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_3f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_450);
  key_05._M_string_length._4_4_ = TVar5;
  key_05._0_12_ = in_stack_fffffffffffff528;
  key_05.field_2._M_allocated_capacity = (size_type)pCVar16;
  key_05.field_2._8_8_ = uVar14;
  val_05.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff550;
  val_05._0_8_ = blockindex;
  val_05.val._M_dataplus._M_p._4_4_ = uVar7;
  val_05.val._M_string_length._0_4_ = TVar6;
  val_05.val._M_string_length._4_4_ = uVar18;
  val_05.val.field_2._M_allocated_capacity = (size_type)this;
  val_05.val.field_2._8_8_ = softforks;
  val_05.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff570;
  val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff588;
  val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff58c;
  val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff590;
  val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff594;
  val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff598;
  UniValue::pushKV(&local_90,key_05,val_05);
  pos = (DeploymentPos)uVar14;
  pCVar17 = blockindex;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_3f8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3f8.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8.val._M_dataplus._M_p != &local_3f8.val.field_2) {
    operator_delete(local_3f8.val._M_dataplus._M_p,local_3f8.val.field_2._M_allocated_capacity + 1);
  }
  pCVar15 = pCVar16;
  if ((pointer)local_450._0_8_ != pcVar1) {
    operator_delete((void *)local_450._0_8_,stack0xfffffffffffffbc0 + 1);
  }
  if (local_3a0[0] != local_390) {
    operator_delete(local_3a0[0],local_390[0] + 1);
  }
  if (uVar7 < 2) {
    local_470 = local_460;
    local_450._8_8_ = acStack_43a + 2;
    local_450._0_4_ = 1;
    local_438._M_local_buf[0] = '\0';
    local_438._1_7_ = (undefined7)local_460._1_8_;
    local_438._M_local_buf[8] = SUB81(local_460._1_8_,7);
    local_438._9_4_ = local_457;
    local_438._13_2_ = local_453;
    local_438._M_local_buf[0xf] = local_451;
    unique0x10004f4b = 0;
    local_468 = 0;
    local_460[0] = 0;
    local_428.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_428.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_428.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_410.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_410.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_410.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    in_stack_fffffffffffff588 = 0;
    in_stack_fffffffffffff58c = 0;
    in_stack_fffffffffffff590 = 0;
    pUVar20 = (pointer)0x0;
    VersionBitsCache::Statistics
              ((BIP9Stats *)&stack0xfffffffffffff574,blockindex,
               &((pCVar16->m_options).chainparams)->consensus,pos,
               (vector<bool,_std::allocator<bool>_> *)&stack0xfffffffffffff588);
    local_490[0] = local_480;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"period","");
    UniValue::UniValue<int_&,_int,_true>(&local_4e8,(int *)&stack0xfffffffffffff574);
    key_06._M_string_length._4_4_ = TVar5;
    key_06._0_12_ = in_stack_fffffffffffff528;
    key_06.field_2._M_allocated_capacity = (size_type)pCVar15;
    key_06.field_2._8_8_ = uVar14;
    val_06.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff550;
    val_06._0_8_ = pCVar17;
    val_06.val._M_dataplus._M_p._4_4_ = uVar7;
    val_06.val._M_string_length._0_4_ = TVar6;
    val_06.val._M_string_length._4_4_ = uVar18;
    val_06.val.field_2._M_allocated_capacity = (size_type)this;
    val_06.val.field_2._8_8_ = softforks;
    val_06.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffff570;
    val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff588;
    val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff58c;
    val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff590;
    val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff594;
    val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pUVar20;
    UniValue::pushKV((UniValue *)local_450,key_06,val_06);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_4e8.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4e8.keys);
    blockindex = pCVar17;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8.val._M_dataplus._M_p != &local_4e8.val.field_2) {
      operator_delete(local_4e8.val._M_dataplus._M_p,local_4e8.val.field_2._M_allocated_capacity + 1
                     );
      blockindex = pCVar17;
    }
    if (local_490[0] != local_480) {
      operator_delete(local_490[0],local_480[0] + 1);
    }
    local_508[0] = local_4f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"elapsed","");
    UniValue::UniValue<int_&,_int,_true>(&local_560,(int *)&stack0xfffffffffffff57c);
    key_07._M_string_length._4_4_ = TVar5;
    key_07._0_12_ = in_stack_fffffffffffff528;
    key_07.field_2._M_allocated_capacity = (size_type)pCVar15;
    key_07.field_2._8_8_ = uVar14;
    val_07.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff550;
    val_07._0_8_ = blockindex;
    val_07.val._M_dataplus._M_p._4_4_ = uVar7;
    val_07.val._M_string_length._0_4_ = TVar6;
    val_07.val._M_string_length._4_4_ = uVar18;
    val_07.val.field_2._M_allocated_capacity = (size_type)this;
    val_07.val.field_2._8_8_ = softforks;
    val_07.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffff570;
    val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff588;
    val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff58c;
    val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff590;
    val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff594;
    val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pUVar20;
    UniValue::pushKV((UniValue *)local_450,key_07,val_07);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_560.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_560.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_560.val._M_dataplus._M_p != &local_560.val.field_2) {
      operator_delete(local_560.val._M_dataplus._M_p,local_560.val.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_508[0] != local_4f8) {
      operator_delete(local_508[0],local_4f8[0] + 1);
    }
    local_580[0] = local_570;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"count","");
    UniValue::UniValue<int_&,_int,_true>(&local_5d8,(int *)&stack0xfffffffffffff580);
    key_08._M_string_length._4_4_ = TVar5;
    key_08._0_12_ = in_stack_fffffffffffff528;
    key_08.field_2._M_allocated_capacity = (size_type)pCVar15;
    key_08.field_2._8_8_ = uVar14;
    val_08.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff550;
    val_08._0_8_ = blockindex;
    val_08.val._M_dataplus._M_p._4_4_ = uVar7;
    val_08.val._M_string_length._0_4_ = TVar6;
    val_08.val._M_string_length._4_4_ = uVar18;
    val_08.val.field_2._M_allocated_capacity = (size_type)this;
    val_08.val.field_2._8_8_ = softforks;
    val_08.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffff570;
    val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff588;
    val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff58c;
    val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff590;
    val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff594;
    val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pUVar20;
    UniValue::pushKV((UniValue *)local_450,key_08,val_08);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_5d8.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_5d8.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8.val._M_dataplus._M_p != &local_5d8.val.field_2) {
      operator_delete(local_5d8.val._M_dataplus._M_p,local_5d8.val.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_580[0] != local_570) {
      operator_delete(local_580[0],local_570[0] + 1);
    }
    if (TVar6 != LOCKED_IN) {
      local_5f8[0] = local_5e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5f8,"threshold","");
      UniValue::UniValue<int_&,_int,_true>(&local_650,(int *)&stack0xfffffffffffff578);
      key_09._M_string_length._4_4_ = TVar5;
      key_09._0_12_ = in_stack_fffffffffffff528;
      key_09.field_2._M_allocated_capacity = (size_type)pCVar15;
      key_09.field_2._8_8_ = uVar14;
      val_09.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff550;
      val_09._0_8_ = blockindex;
      val_09.val._M_dataplus._M_p._4_4_ = uVar7;
      val_09.val._M_string_length._0_4_ = TVar6;
      val_09.val._M_string_length._4_4_ = uVar18;
      val_09.val.field_2._M_allocated_capacity = (size_type)this;
      val_09.val.field_2._8_8_ = softforks;
      val_09.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data =
           (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )in_stack_fffffffffffff570;
      val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff588;
      val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff58c;
      val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff590;
      val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff594;
      val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pUVar20;
      UniValue::pushKV((UniValue *)local_450,key_09,val_09);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_650.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_650.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_650.val._M_dataplus._M_p != &local_650.val.field_2) {
        operator_delete(local_650.val._M_dataplus._M_p,
                        local_650.val.field_2._M_allocated_capacity + 1);
      }
      if (local_5f8[0] != local_5e8) {
        operator_delete(local_5f8[0],local_5e8[0] + 1);
      }
      local_670[0] = local_660;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"possible","");
      UniValue::UniValue<bool_&,_bool,_true>(&local_6c8,(bool *)&stack0xfffffffffffff584);
      key_10._M_string_length._4_4_ = TVar5;
      key_10._0_12_ = in_stack_fffffffffffff528;
      key_10.field_2._M_allocated_capacity = (size_type)pCVar15;
      key_10.field_2._8_8_ = uVar14;
      val_10.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff550;
      val_10._0_8_ = blockindex;
      val_10.val._M_dataplus._M_p._4_4_ = uVar7;
      val_10.val._M_string_length._0_4_ = TVar6;
      val_10.val._M_string_length._4_4_ = uVar18;
      val_10.val.field_2._M_allocated_capacity = (size_type)this;
      val_10.val.field_2._8_8_ = softforks;
      val_10.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data =
           (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )in_stack_fffffffffffff570;
      val_10.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff588;
      val_10.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff58c;
      val_10.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff590;
      val_10.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff594;
      val_10.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pUVar20;
      UniValue::pushKV((UniValue *)local_450,key_10,val_10);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_6c8.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_6c8.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c8.val._M_dataplus._M_p != &local_6c8.val.field_2) {
        operator_delete(local_6c8.val._M_dataplus._M_p,
                        local_6c8.val.field_2._M_allocated_capacity + 1);
      }
      if (local_670[0] != local_660) {
        operator_delete(local_670[0],local_660[0] + 1);
      }
    }
    local_6e8[0] = local_6d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"statistics","");
    local_740 = local_450._0_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._8_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(acStack_43a + 2)) {
      local_728._8_8_ =
           CONCAT17(local_438._M_local_buf[0xf],
                    CONCAT25(local_438._13_2_,CONCAT41(local_438._9_4_,local_438._M_local_buf[8])));
      local_738 = &local_728;
    }
    else {
      local_738 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_450._8_8_;
    }
    local_728._M_allocated_capacity._1_7_ = local_438._1_7_;
    local_728._M_local_buf[0] = local_438._M_local_buf[0];
    local_730 = stack0xfffffffffffffbc0;
    unique0x10004f53 = 0;
    local_438._M_local_buf[0] = '\0';
    local_718.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_428.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_718.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_428.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_718.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_428.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_428.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_428.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_428.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_700.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start =
         vStack_410.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_700.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish =
         vStack_410.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_700.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         vStack_410.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    vStack_410.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_410.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_410.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    key_11._M_string_length._4_4_ = TVar5;
    key_11._0_12_ = in_stack_fffffffffffff528;
    key_11.field_2._M_allocated_capacity = (size_type)pCVar15;
    key_11.field_2._8_8_ = uVar14;
    val_11.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff550;
    val_11._0_8_ = blockindex;
    val_11.val._M_dataplus._M_p._4_4_ = uVar7;
    val_11.val._M_string_length._0_4_ = TVar6;
    val_11.val._M_string_length._4_4_ = uVar18;
    val_11.val.field_2._M_allocated_capacity = (size_type)this;
    val_11.val.field_2._8_8_ = softforks;
    val_11.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffff570;
    val_11.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff588;
    val_11.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff58c;
    val_11.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff590;
    val_11.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff594;
    val_11.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pUVar20;
    local_450._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(acStack_43a + 2);
    UniValue::pushKV(&local_90,key_11,val_11);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_700);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_718);
    if (local_738 != &local_728) {
      operator_delete(local_738,local_728._M_allocated_capacity + 1);
    }
    if (local_6e8[0] != local_6d8) {
      operator_delete(local_6e8[0],local_6d8[0] + 1);
    }
    local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
    local_760._M_string_length = 0;
    local_760.field_2._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (&local_760,
               ((long)pUVar20 - CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588)) * 8);
    pUVar11 = (pointer)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588);
    in_stack_fffffffffffff598 = pUVar20;
    if (pUVar11 != pUVar20) {
      uVar10 = 0;
      do {
        __c = '-';
        if ((*(ulong *)pUVar11 >> (uVar10 & 0x3f) & 1) != 0) {
          __c = '#';
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_760,__c);
        iVar8 = (int)uVar10;
        pUVar11 = (pointer)(&pUVar11->typ + (ulong)(iVar8 == 0x3f) * 2);
        uVar10 = (ulong)(iVar8 + 1);
        if (iVar8 == 0x3f) {
          uVar10 = 0;
        }
      } while (pUVar11 != pUVar20 || (int)uVar10 != 0);
    }
    local_780[0] = local_770;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_780,"signalling","");
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_7d8,&local_760);
    pos = (DeploymentPos)uVar14;
    key_12._M_string_length._4_4_ = TVar5;
    key_12._0_12_ = in_stack_fffffffffffff528;
    key_12.field_2._M_allocated_capacity = (size_type)pCVar15;
    key_12.field_2._8_8_ = uVar14;
    val_12.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff550;
    val_12._0_8_ = blockindex;
    val_12.val._M_dataplus._M_p._4_4_ = uVar7;
    val_12.val._M_string_length._0_4_ = TVar6;
    val_12.val._M_string_length._4_4_ = uVar18;
    val_12.val.field_2._M_allocated_capacity = (size_type)this;
    val_12.val.field_2._8_8_ = softforks;
    val_12.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffff570;
    val_12.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff588;
    val_12.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff58c;
    val_12.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff590;
    val_12.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff594;
    val_12.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff598;
    pCVar17 = blockindex;
    UniValue::pushKV(&local_90,key_12,val_12);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_7d8.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_7d8.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7d8.val._M_dataplus._M_p != &local_7d8.val.field_2) {
      operator_delete(local_7d8.val._M_dataplus._M_p,local_7d8.val.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_780[0] != local_770) {
      operator_delete(local_780[0],local_770[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_760._M_dataplus._M_p != &local_760.field_2) {
      operator_delete(local_760._M_dataplus._M_p,
                      CONCAT71(local_760.field_2._M_allocated_capacity._1_7_,
                               local_760.field_2._M_local_buf[0]) + 1);
    }
    pvVar3 = (void *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,-(long)pvVar3);
    }
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_410);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(acStack_43a + 2)) {
      operator_delete((void *)local_450._8_8_,
                      CONCAT71(local_438._1_7_,local_438._M_local_buf[0]) + 1);
    }
  }
  paVar13 = &local_90.val.field_2;
  local_7f8 = local_7e8;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(acStack_43a + 2);
  local_450._0_4_ = 1;
  local_438._M_local_buf[0] = '\0';
  local_438._1_7_ = (undefined7)local_7e8._1_8_;
  local_438._M_local_buf[8] = SUB81(local_7e8._1_8_,7);
  local_438._9_4_ = local_7df;
  local_438._13_2_ = local_7db;
  local_438._M_local_buf[0xf] = local_7d9;
  unique0x10004f5b = 0;
  local_7f0 = 0;
  local_7e8[0] = 0;
  local_428.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_428.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_410.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  vStack_410.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  vStack_410.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_818[0] = local_808;
  local_450._8_8_ = paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_818,"type","");
  UniValue::UniValue<const_char_(&)[5],_char[5],_true>(&local_870,(char (*) [5])"bip9");
  key_13._M_string_length._4_4_ = TVar5;
  key_13._0_12_ = in_stack_fffffffffffff528;
  key_13.field_2._M_allocated_capacity = (size_type)pCVar15;
  key_13.field_2._8_8_ = uVar14;
  val_13.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff550;
  val_13._0_8_ = pCVar17;
  val_13.val._M_dataplus._M_p._4_4_ = uVar7;
  val_13.val._M_string_length._0_4_ = TVar6;
  val_13.val._M_string_length._4_4_ = uVar18;
  val_13.val.field_2._M_allocated_capacity = (size_type)this;
  val_13.val.field_2._8_8_ = softforks;
  val_13.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff570;
  val_13.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff588;
  val_13.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff58c;
  val_13.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff590;
  val_13.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff594;
  val_13.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff598;
  UniValue::pushKV((UniValue *)local_450,key_13,val_13);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_870.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_870.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_870.val._M_dataplus._M_p != &local_870.val.field_2) {
    operator_delete(local_870.val._M_dataplus._M_p,local_870.val.field_2._M_allocated_capacity + 1);
  }
  pVVar19 = this;
  if (local_818[0] != local_808) {
    operator_delete(local_818[0],local_808[0] + 1);
  }
  if (TVar5 == ACTIVE) {
    local_890[0] = local_880;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_890,"height","");
    in_stack_fffffffffffff588 =
         VersionBitsCache::StateSinceHeight
                   (this,blockindex,&((pCVar15->m_options).chainparams)->consensus,pos);
    UniValue::UniValue<int,_int,_true>(&local_8e8,(int *)&stack0xfffffffffffff588);
    key_14._M_string_length._4_4_ = TVar5;
    key_14._0_12_ = in_stack_fffffffffffff528;
    key_14.field_2._M_allocated_capacity = (size_type)pCVar15;
    key_14.field_2._8_8_ = uVar14;
    val_14.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff550;
    val_14._0_8_ = pCVar17;
    val_14.val._M_dataplus._M_p._4_4_ = uVar7;
    val_14.val._M_string_length._0_4_ = TVar6;
    val_14.val._M_string_length._4_4_ = uVar18;
    val_14.val.field_2._M_allocated_capacity = (size_type)pVVar19;
    val_14.val.field_2._8_8_ = softforks;
    val_14.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data =
         (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )in_stack_fffffffffffff570;
    val_14.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = in_stack_fffffffffffff588;
    val_14.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff58c;
    val_14.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff590;
    val_14.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff594;
    val_14.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff598;
    UniValue::pushKV((UniValue *)local_450,key_14,val_14);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_8e8.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_8e8.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8e8.val._M_dataplus._M_p != &local_8e8.val.field_2) {
      operator_delete(local_8e8.val._M_dataplus._M_p,local_8e8.val.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_890[0] != local_880) {
      operator_delete(local_890[0],local_880[0] + 1);
    }
  }
  local_908[0] = local_8f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_908,"active","");
  iVar8 = CONCAT31((int3)((uint)in_stack_fffffffffffff588 >> 8),TVar5 == ACTIVE);
  UniValue::UniValue<bool,_bool,_true>(&local_960,(bool *)&stack0xfffffffffffff588);
  key_15._M_string_length._4_4_ = TVar5;
  key_15._0_12_ = in_stack_fffffffffffff528;
  key_15.field_2._M_allocated_capacity = (size_type)pCVar15;
  key_15.field_2._8_8_ = uVar14;
  val_15.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff550;
  val_15._0_8_ = pCVar17;
  val_15.val._M_dataplus._M_p._4_4_ = uVar7;
  val_15.val._M_string_length._0_4_ = TVar6;
  val_15.val._M_string_length._4_4_ = uVar18;
  val_15.val.field_2._M_allocated_capacity = (size_type)pVVar19;
  val_15.val.field_2._8_8_ = softforks;
  val_15.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff570;
  val_15.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = iVar8;
  val_15.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff58c;
  val_15.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff590;
  val_15.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff594;
  val_15.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff598;
  UniValue::pushKV((UniValue *)local_450,key_15,val_15);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_960.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_960.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_960.val._M_dataplus._M_p != &local_960.val.field_2) {
    operator_delete(local_960.val._M_dataplus._M_p,local_960.val.field_2._M_allocated_capacity + 1);
  }
  if (local_908[0] != local_8f8) {
    operator_delete(local_908[0],local_8f8[0] + 1);
  }
  local_980[0] = local_970;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_980,"bip9","");
  local_9d8 = local_90.typ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.val._M_dataplus._M_p == paVar13) {
    local_9c0._8_8_ =
         CONCAT17(local_90.val.field_2._M_local_buf[0xf],
                  CONCAT25(local_90.val.field_2._13_2_,
                           CONCAT41(local_90.val.field_2._9_4_,local_90.val.field_2._M_local_buf[8])
                          ));
    local_9d0 = &local_9c0;
  }
  else {
    local_9d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90.val._M_dataplus._M_p;
  }
  local_9c0._M_allocated_capacity._1_7_ = local_90.val.field_2._M_allocated_capacity._1_7_;
  local_9c0._M_local_buf[0] = local_90.val.field_2._M_local_buf[0];
  local_9c8 = local_90.val._M_string_length;
  local_90.val._M_string_length = 0;
  local_90.val.field_2._M_local_buf[0] = '\0';
  local_9b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_90.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_9b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_90.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_9b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_90.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_998.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_998.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_998.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  key_16._M_string_length._4_4_ = TVar5;
  key_16._0_12_ = in_stack_fffffffffffff528;
  key_16.field_2._M_allocated_capacity = (size_type)pCVar15;
  key_16.field_2._8_8_ = uVar14;
  val_16.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff550;
  val_16._0_8_ = pCVar17;
  val_16.val._M_dataplus._M_p._4_4_ = uVar7;
  val_16.val._M_string_length._0_4_ = TVar6;
  val_16.val._M_string_length._4_4_ = uVar18;
  val_16.val.field_2._M_allocated_capacity = (size_type)pVVar19;
  val_16.val.field_2._8_8_ = softforks;
  val_16.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff570;
  val_16.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = iVar8;
  val_16.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff58c;
  val_16.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff590;
  val_16.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff594;
  val_16.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff598;
  local_90.val._M_dataplus._M_p = (pointer)paVar13;
  UniValue::pushKV((UniValue *)local_450,key_16,val_16);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_998);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_9b0);
  if (local_9d0 != &local_9c0) {
    operator_delete(local_9d0,local_9c0._M_allocated_capacity + 1);
  }
  if (local_980[0] != local_970) {
    operator_delete(local_980[0],local_970[0] + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_9f8,
             *(char **)((long)&VersionBitsDeploymentInfo[0].name + (ulong)(uint)((int)uVar14 << 4)),
             (allocator<char> *)&stack0xfffffffffffff588);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._8_8_ == paVar2) {
    local_a38._8_8_ =
         CONCAT17(local_438._M_local_buf[0xf],
                  CONCAT25(local_438._13_2_,CONCAT41(local_438._9_4_,local_438._M_local_buf[8])));
    local_a48 = &local_a38;
  }
  else {
    local_a48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_450._8_8_;
  }
  local_a38._M_allocated_capacity._1_7_ = local_438._1_7_;
  local_a38._M_local_buf[0] = local_438._M_local_buf[0];
  unique0x10004f63 = 0;
  local_438._M_local_buf[0] = '\0';
  local_a28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_428.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_a28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_428.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_a28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_428.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_428.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_428.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a10.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = vStack_410.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_a10.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = vStack_410.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_a10.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       vStack_410.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  vStack_410.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  vStack_410.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  vStack_410.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  key_17._M_string_length._4_4_ = TVar5;
  key_17._0_12_ = in_stack_fffffffffffff528;
  key_17.field_2._M_allocated_capacity = (size_type)pCVar15;
  key_17.field_2._8_8_ = uVar14;
  val_17.val._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff550;
  val_17._0_8_ = pCVar17;
  val_17.val._M_dataplus._M_p._4_4_ = uVar7;
  val_17.val._M_string_length._0_4_ = TVar6;
  val_17.val._M_string_length._4_4_ = uVar18;
  val_17.val.field_2._M_allocated_capacity = (size_type)pVVar19;
  val_17.val.field_2._8_8_ = softforks;
  val_17.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff570;
  val_17.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = iVar8;
  val_17.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = in_stack_fffffffffffff58c;
  val_17.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff590;
  val_17.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffff594;
  val_17.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff598;
  local_450._8_8_ = paVar2;
  UniValue::pushKV(softforks,key_17,val_17);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_a10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a28);
  if (local_a48 != &local_a38) {
    operator_delete(local_a48,local_a38._M_allocated_capacity + 1);
  }
  if (local_9f8[0] != local_9e8) {
    operator_delete(local_9f8[0],local_9e8[0] + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_410);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._8_8_ != paVar2) {
    operator_delete((void *)local_450._8_8_,CONCAT71(local_438._1_7_,local_438._M_local_buf[0]) + 1)
    ;
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.val._M_dataplus._M_p != &local_90.val.field_2) {
    operator_delete(local_90.val._M_dataplus._M_p,
                    CONCAT71(local_90.val.field_2._M_allocated_capacity._1_7_,
                             local_90.val.field_2._M_local_buf[0]) + 1);
  }
LAB_009d8a50:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void SoftForkDescPushBack(const CBlockIndex* blockindex, UniValue& softforks, const ChainstateManager& chainman, Consensus::DeploymentPos id)
{
    // For BIP9 deployments.

    if (!DeploymentEnabled(chainman, id)) return;
    if (blockindex == nullptr) return;

    auto get_state_name = [](const ThresholdState state) -> std::string {
        switch (state) {
        case ThresholdState::DEFINED: return "defined";
        case ThresholdState::STARTED: return "started";
        case ThresholdState::LOCKED_IN: return "locked_in";
        case ThresholdState::ACTIVE: return "active";
        case ThresholdState::FAILED: return "failed";
        }
        return "invalid";
    };

    UniValue bip9(UniValue::VOBJ);

    const ThresholdState next_state = chainman.m_versionbitscache.State(blockindex, chainman.GetConsensus(), id);
    const ThresholdState current_state = chainman.m_versionbitscache.State(blockindex->pprev, chainman.GetConsensus(), id);

    const bool has_signal = (ThresholdState::STARTED == current_state || ThresholdState::LOCKED_IN == current_state);

    // BIP9 parameters
    if (has_signal) {
        bip9.pushKV("bit", chainman.GetConsensus().vDeployments[id].bit);
    }
    bip9.pushKV("start_time", chainman.GetConsensus().vDeployments[id].nStartTime);
    bip9.pushKV("timeout", chainman.GetConsensus().vDeployments[id].nTimeout);
    bip9.pushKV("min_activation_height", chainman.GetConsensus().vDeployments[id].min_activation_height);

    // BIP9 status
    bip9.pushKV("status", get_state_name(current_state));
    bip9.pushKV("since", chainman.m_versionbitscache.StateSinceHeight(blockindex->pprev, chainman.GetConsensus(), id));
    bip9.pushKV("status_next", get_state_name(next_state));

    // BIP9 signalling status, if applicable
    if (has_signal) {
        UniValue statsUV(UniValue::VOBJ);
        std::vector<bool> signals;
        BIP9Stats statsStruct = chainman.m_versionbitscache.Statistics(blockindex, chainman.GetConsensus(), id, &signals);
        statsUV.pushKV("period", statsStruct.period);
        statsUV.pushKV("elapsed", statsStruct.elapsed);
        statsUV.pushKV("count", statsStruct.count);
        if (ThresholdState::LOCKED_IN != current_state) {
            statsUV.pushKV("threshold", statsStruct.threshold);
            statsUV.pushKV("possible", statsStruct.possible);
        }
        bip9.pushKV("statistics", std::move(statsUV));

        std::string sig;
        sig.reserve(signals.size());
        for (const bool s : signals) {
            sig.push_back(s ? '#' : '-');
        }
        bip9.pushKV("signalling", sig);
    }

    UniValue rv(UniValue::VOBJ);
    rv.pushKV("type", "bip9");
    if (ThresholdState::ACTIVE == next_state) {
        rv.pushKV("height", chainman.m_versionbitscache.StateSinceHeight(blockindex, chainman.GetConsensus(), id));
    }
    rv.pushKV("active", ThresholdState::ACTIVE == next_state);
    rv.pushKV("bip9", std::move(bip9));

    softforks.pushKV(DeploymentName(id), std::move(rv));
}